

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O3

int Sfm_TruthToCnf(word Truth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vCnf)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  char cVar14;
  char cVar15;
  word local_38;
  
  vCnf->nSize = 0;
  local_38 = Truth;
  if (Truth + 1 < 2) {
    iVar6 = 0;
    pcVar8 = vCnf->pArray;
    if (vCnf->nCap == 0) {
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
        iVar6 = 0;
      }
      else {
        pcVar8 = (char *)realloc(pcVar8,0x10);
        iVar6 = vCnf->nSize;
      }
      vCnf->pArray = pcVar8;
      vCnf->nCap = 0x10;
    }
    vCnf->nSize = iVar6 + 1;
    pcVar8[iVar6] = Truth == 0;
    uVar3 = vCnf->nSize;
    if (uVar3 == vCnf->nCap) {
      if ((int)uVar3 < 0x10) {
        if (vCnf->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(vCnf->pArray,0x10);
        }
        vCnf->pArray = pcVar8;
        vCnf->nCap = 0x10;
      }
      else {
        sVar4 = (ulong)uVar3 * 2;
        if (vCnf->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar4);
        }
        else {
          pcVar8 = (char *)realloc(vCnf->pArray,sVar4);
        }
        vCnf->pArray = pcVar8;
        vCnf->nCap = (int)sVar4;
      }
    }
    else {
      pcVar8 = vCnf->pArray;
    }
    iVar6 = vCnf->nSize;
    vCnf->nSize = iVar6 + 1;
    pcVar8[iVar6] = -1;
    iVar6 = 1;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmCnf.c"
                    ,0x54,"int Sfm_TruthToCnf(word, int, Vec_Int_t *, Vec_Str_t *)");
    }
    lVar13 = 0;
    iVar6 = 0;
    bVar5 = true;
    do {
      bVar9 = bVar5;
      local_38 = local_38 ^ -lVar13;
      iVar7 = Kit_TruthIsop((uint *)&local_38,nVars,vCover,0);
      if (iVar7 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmCnf.c"
                      ,0x59,"int Sfm_TruthToCnf(word, int, Vec_Int_t *, Vec_Str_t *)");
      }
      iVar7 = vCover->nSize;
      if (0 < iVar7) {
        lVar11 = 0;
        do {
          iVar1 = vCover->pArray[lVar11];
          bVar12 = 0;
          cVar15 = '\0';
          iVar10 = nVars;
          do {
            switch(iVar1 >> (bVar12 & 0x1f) & 3) {
            case 0:
              goto switchD_004b293e_caseD_0;
            case 1:
              cVar14 = cVar15 * '\x02';
              break;
            case 2:
              cVar14 = bVar12 + 1;
              break;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmCnf.c"
                            ,0x65,"int Sfm_TruthToCnf(word, int, Vec_Int_t *, Vec_Str_t *)");
            }
            uVar3 = vCnf->nSize;
            if (uVar3 == vCnf->nCap) {
              if ((int)uVar3 < 0x10) {
                if (vCnf->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(vCnf->pArray,0x10);
                }
                vCnf->pArray = pcVar8;
                vCnf->nCap = 0x10;
              }
              else {
                sVar4 = (ulong)uVar3 * 2;
                if (vCnf->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar4);
                }
                else {
                  pcVar8 = (char *)realloc(vCnf->pArray,sVar4);
                }
                vCnf->pArray = pcVar8;
                vCnf->nCap = (int)sVar4;
              }
            }
            else {
              pcVar8 = vCnf->pArray;
            }
            iVar2 = vCnf->nSize;
            vCnf->nSize = iVar2 + 1;
            pcVar8[iVar2] = cVar14;
switchD_004b293e_caseD_0:
            cVar15 = cVar15 + '\x01';
            bVar12 = bVar12 + 2;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
          uVar3 = vCnf->nSize;
          if (uVar3 == vCnf->nCap) {
            if ((int)uVar3 < 0x10) {
              if (vCnf->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(vCnf->pArray,0x10);
              }
              vCnf->pArray = pcVar8;
              vCnf->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar3 * 2;
              if (vCnf->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar4);
              }
              else {
                pcVar8 = (char *)realloc(vCnf->pArray,sVar4);
              }
              vCnf->pArray = pcVar8;
              vCnf->nCap = (int)sVar4;
            }
          }
          else {
            pcVar8 = vCnf->pArray;
          }
          iVar1 = vCnf->nSize;
          vCnf->nSize = iVar1 + 1;
          pcVar8[iVar1] = (byte)lVar13 | (char)nVars * '\x02';
          uVar3 = vCnf->nSize;
          if (uVar3 == vCnf->nCap) {
            if ((int)uVar3 < 0x10) {
              if (vCnf->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(vCnf->pArray,0x10);
              }
              vCnf->pArray = pcVar8;
              vCnf->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar3 * 2;
              if (vCnf->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar4);
              }
              else {
                pcVar8 = (char *)realloc(vCnf->pArray,sVar4);
              }
              vCnf->pArray = pcVar8;
              vCnf->nCap = (int)sVar4;
            }
          }
          else {
            pcVar8 = vCnf->pArray;
          }
          iVar1 = vCnf->nSize;
          vCnf->nSize = iVar1 + 1;
          pcVar8[iVar1] = -1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < vCover->nSize);
      }
      iVar6 = iVar6 + iVar7;
      lVar13 = 1;
      bVar5 = false;
    } while (bVar9);
  }
  return iVar6;
}

Assistant:

int Sfm_TruthToCnf( word Truth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vCnf )
{
    Vec_StrClear( vCnf );
    if ( Truth == 0 || ~Truth == 0 )
    {
//        assert( nVars == 0 );
        Vec_StrPush( vCnf, (char)(Truth == 0) );
        Vec_StrPush( vCnf, (char)-1 );
        return 1;
    }
    else 
    {
        int i, k, c, RetValue, Literal, Cube, nCubes = 0;
        assert( nVars > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            Truth = c ? ~Truth : Truth;
            RetValue = Kit_TruthIsop( (unsigned *)&Truth, nVars, vCover, 0 );
            assert( RetValue == 0 );
            nCubes += Vec_IntSize( vCover );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                for ( k = 0; k < nVars; k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
                Vec_StrPush( vCnf, (char)Abc_Var2Lit(nVars, c) );
                Vec_StrPush( vCnf, (char)-1 );
            }
        }
        return nCubes;
    }
}